

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::color4d>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,color4d *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  anon_struct_8_0_00000001_for___align local_91;
  double dStack_89;
  double local_81;
  double dStack_79;
  optional<tinyusdz::value::color4d> local_70;
  anon_struct_8_0_00000001_for___align local_41;
  double dStack_39;
  double local_31;
  double dStack_29;
  
  if (v == (color4d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_value<tinyusdz::value::color4d>(&local_70,this);
    if (local_70.has_value_ == true) {
      local_31 = (double)local_70.contained._16_8_;
      dStack_29 = (double)local_70.contained._24_8_;
      local_41 = local_70.contained.data.__align;
      dStack_39 = (double)local_70.contained._8_8_;
      local_91 = local_70.contained.data.__align;
      dStack_89 = (double)local_70.contained._8_8_;
      local_81 = (double)local_70.contained._16_8_;
      dStack_79 = (double)local_70.contained._24_8_;
    }
    if (local_70.has_value_ != false) goto LAB_001e8b41;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::color4d,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<tinyusdz::value::color4d>(&local_70,this);
    if (local_70.has_value_ == true) {
      local_91 = local_70.contained.data.__align;
      dStack_89 = (double)local_70.contained._8_8_;
      local_81 = (double)local_70.contained._16_8_;
      dStack_79 = (double)local_70.contained._24_8_;
    }
    if (local_70.has_value_ != false) {
LAB_001e8b41:
      v->b = local_81;
      v->a = dStack_79;
      v->r = (double)local_91;
      v->g = dStack_89;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }